

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::array<unsigned_long,_4UL>_&> * __thiscall
testing::internal::ElementsAreArrayMatcher::operator_cast_to_Matcher
          (Matcher<const_std::array<unsigned_long,_4UL>_&> *__return_storage_ptr__,
          ElementsAreArrayMatcher *this)

{
  ElementsAreMatcherImpl<std::array<unsigned_long,4ul>const&> *this_00;
  undefined4 *puVar1;
  
  this_00 = (ElementsAreMatcherImpl<std::array<unsigned_long,4ul>const&> *)operator_new(0x20);
  ElementsAreMatcherImpl<std::array<unsigned_long,4ul>const&>::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (this_00,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )*(unsigned_long **)this,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )*(unsigned_long **)(this + 8));
  (__return_storage_ptr__->super_MatcherBase<const_std::array<unsigned_long,_4UL>_&>).vtable_ =
       (VTable *)
       MatcherBase<std::array<unsigned_long,4ul>const&>::
       GetVTable<testing::internal::MatcherBase<std::array<unsigned_long,4ul>const&>::ValuePolicy<testing::MatcherInterface<std::array<unsigned_long,4ul>const&>const*,true>>()
       ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(ElementsAreMatcherImpl<std::array<unsigned_long,4ul>const&> **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->super_MatcherBase<const_std::array<unsigned_long,_4UL>_&>).buffer_.ptr =
       puVar1;
  (__return_storage_ptr__->super_MatcherBase<const_std::array<unsigned_long,_4UL>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001fec40;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value,
        "use UnorderedElementsAreArray with hash tables");

    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers_.begin(), matchers_.end()));
  }